

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sap_Apu.cpp
# Opt level: O0

void __thiscall Sap_Apu_Impl::Sap_Apu_Impl(Sap_Apu_Impl *this)

{
  long in_RDI;
  
  Blip_Synth<12,_1>::Blip_Synth((Blip_Synth<12,_1> *)0x9895c8);
  gen_poly(0xc,2,(byte_ *)(in_RDI + 0x330));
  gen_poly(0x108,0x40,(byte_ *)(in_RDI + 0x332));
  gen_poly(0x10800,0x4000,(byte_ *)(in_RDI + 0x372));
  return;
}

Assistant:

Sap_Apu_Impl::Sap_Apu_Impl()
{
	gen_poly( POLY_MASK(  4, 1, 0 ), sizeof poly4,  poly4  );
	gen_poly( POLY_MASK(  9, 5, 0 ), sizeof poly9,  poly9  );
	gen_poly( POLY_MASK( 17, 5, 0 ), sizeof poly17, poly17 );
	
	if ( 0 ) // comment out to recauculate poly5 constant
	{
		byte poly5 [4];
		gen_poly( POLY_MASK(  5, 2, 0 ), sizeof poly5,  poly5  );
		blargg_ulong n = poly5 [3] * 0x1000000L + poly5 [2] * 0x10000L + 
				poly5 [1] * 0x100L + poly5 [0];
		blargg_ulong rev = n & 1;
		for ( int i = 1; i < poly5_len; i++ )
			rev |= (n >> i & 1) << (poly5_len - i);
		debug_printf( "poly5: 0x%08lX\n", rev );
	}
}